

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TransSetSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::TransSetSyntax,slang::syntax::TransSetSyntax_const&>
          (BumpAllocator *this,TransSetSyntax *args)

{
  TransSetSyntax *pTVar1;
  TransSetSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pTVar1 = (TransSetSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::TransSetSyntax::TransSetSyntax(in_RSI,pTVar1);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }